

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NamespaceScope.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::NamespaceScope::NamespaceScope
          (NamespaceScope *this,NamespaceScope *initialize,MemoryManager *manager)

{
  StackElem *pSVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  XMLCh *prefixToAdd;
  XMLCh *prefix;
  uint mapIndex;
  StackElem *curRow;
  uint index;
  MemoryManager *manager_local;
  NamespaceScope *initialize_local;
  NamespaceScope *this_local;
  
  XMemory::XMemory((XMemory *)this);
  XercesNamespaceResolver::XercesNamespaceResolver(&this->super_XercesNamespaceResolver);
  (this->super_XercesNamespaceResolver)._vptr_XercesNamespaceResolver =
       (_func_int **)&PTR_getNamespaceForPrefix_00536968;
  this->fEmptyNamespaceId = 0;
  this->fStackCapacity = 8;
  this->fStackTop = 0;
  XMLStringPool::XMLStringPool(&this->fPrefixPool,0x6d,manager);
  this->fStack = (StackElem **)0x0;
  this->fMemoryManager = manager;
  iVar2 = (*this->fMemoryManager->_vptr_MemoryManager[3])();
  this->fStack = (StackElem **)CONCAT44(extraout_var,iVar2);
  memset(this->fStack,0,(ulong)this->fStackCapacity << 3);
  if (initialize != (NamespaceScope *)0x0) {
    reset(this,initialize->fEmptyNamespaceId);
    for (curRow._0_4_ = initialize->fStackTop; (uint)curRow != 0; curRow._0_4_ = (uint)curRow - 1) {
      pSVar1 = initialize->fStack[(uint)curRow - 1];
      if (pSVar1->fMapCount != 0) {
        for (prefix._4_4_ = 0; prefix._4_4_ < pSVar1->fMapCount; prefix._4_4_ = prefix._4_4_ + 1) {
          prefixToAdd = XMLStringPool::getValueForId
                                  (&initialize->fPrefixPool,pSVar1->fMap[prefix._4_4_].fPrefId);
          uVar3 = (**(this->super_XercesNamespaceResolver)._vptr_XercesNamespaceResolver)
                            (this,prefixToAdd);
          if (uVar3 == this->fEmptyNamespaceId) {
            addPrefix(this,prefixToAdd,pSVar1->fMap[prefix._4_4_].fURIId);
          }
        }
      }
    }
  }
  return;
}

Assistant:

NamespaceScope::NamespaceScope(const NamespaceScope* const initialize, MemoryManager* const manager /*= XMLPlatformUtils::fgMemoryManager*/) :
    fEmptyNamespaceId(0)
    , fStackCapacity(8)
    , fStackTop(0)
    , fPrefixPool(109, manager)
    , fStack(0)
    , fMemoryManager(manager)
{
    // Do an initial allocation of the stack and zero it out
    fStack = (StackElem**) fMemoryManager->allocate
    (
        fStackCapacity * sizeof(StackElem*)
    );//new StackElem*[fStackCapacity];
    memset(fStack, 0, fStackCapacity * sizeof(StackElem*));

    if(initialize)
    {
        reset(initialize->fEmptyNamespaceId);

        // copy the existing bindings
        for (unsigned int index = initialize->fStackTop; index > 0; index--)
        {
            // Get a convenience pointer to the current element
            StackElem* curRow = initialize->fStack[index-1];

            // If no prefixes mapped at this level, then go the next one
            if (!curRow->fMapCount)
                continue;

            for (unsigned int mapIndex = 0; mapIndex < curRow->fMapCount; mapIndex++)
            {
                // go from the id to the prefix
                const XMLCh* prefix = initialize->fPrefixPool.getValueForId(curRow->fMap[mapIndex].fPrefId);

                // if the prefix is not already known, add it
                if(getNamespaceForPrefix(prefix)==fEmptyNamespaceId)
                    addPrefix(prefix, curRow->fMap[mapIndex].fURIId);
            }
        }
    }
}